

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O1

void __thiscall Nes_Apu::Nes_Apu(Nes_Apu *this)

{
  Synth *ctx;
  int i;
  long lVar1;
  
  (this->noise).synth.impulse.eq.treble = 0.0;
  (this->noise).synth.impulse.eq.cutoff = 0;
  (this->noise).synth.impulse.eq.sample_rate = 0xac44;
  lVar1 = 0;
  Blip_Impulse_::init(&(this->noise).synth.impulse,(EVP_PKEY_CTX *)&(this->noise).synth);
  (this->triangle).synth.impulse.eq.treble = 0.0;
  (this->triangle).synth.impulse.eq.cutoff = 0;
  (this->triangle).synth.impulse.eq.sample_rate = 0xac44;
  Blip_Impulse_::init(&(this->triangle).synth.impulse,(EVP_PKEY_CTX *)&(this->triangle).synth);
  (this->dmc).synth.impulse.eq.treble = 0.0;
  (this->dmc).synth.impulse.eq.cutoff = 0;
  (this->dmc).synth.impulse.eq.sample_rate = 0xac44;
  Blip_Impulse_::init(&(this->dmc).synth.impulse,(EVP_PKEY_CTX *)&(this->dmc).synth);
  ctx = &this->square_synth;
  (this->square_synth).impulse.eq.treble = 0.0;
  (this->square_synth).impulse.eq.cutoff = 0;
  (this->square_synth).impulse.eq.sample_rate = 0xac44;
  Blip_Impulse_::init(&(this->square_synth).impulse,(EVP_PKEY_CTX *)ctx);
  (this->dmc).apu = this;
  (this->dmc).rom_reader = (_func_int_void_ptr_cpu_addr_t *)0x0;
  (this->square1).synth = ctx;
  (this->square2).synth = ctx;
  this->irq_notifier_ = (_func_void_void_ptr *)0x0;
  this->oscs[0] = (Nes_Osc *)&this->square1;
  this->oscs[1] = (Nes_Osc *)&this->square2;
  this->oscs[2] = &(this->triangle).super_Nes_Osc;
  this->oscs[3] = (Nes_Osc *)&this->noise;
  this->oscs[4] = &(this->dmc).super_Nes_Osc;
  do {
    this->oscs[lVar1]->output = (Blip_Buffer *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  volume(this,1.0);
  reset(this,false,0);
  return;
}

Assistant:

Nes_Apu::Nes_Apu()
{
	dmc.apu = this;
	dmc.rom_reader = NULL;
	square1.synth = &square_synth;
	square2.synth = &square_synth;
	irq_notifier_ = NULL;
	
	oscs [0] = &square1;
	oscs [1] = &square2;
	oscs [2] = &triangle;
	oscs [3] = &noise;
	oscs [4] = &dmc;
	
	output( NULL );
	volume( 1.0 );
	reset( false );
}